

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeAddOp4Int(Vdbe *p,int op,int p1,int p2,int p3,int p4)

{
  undefined1 *puVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  VdbeOp *pOp;
  int i;
  int in_stack_ffffffffffffffcc;
  int local_4;
  
  local_4 = *(int *)(in_RDI + 0x90);
  if (local_4 < *(int *)(in_RDI + 0x94)) {
    *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + 1;
    puVar1 = (undefined1 *)(*(long *)(in_RDI + 0x88) + (long)local_4 * 0x18);
    *puVar1 = in_SIL;
    *(undefined2 *)(puVar1 + 2) = 0;
    *(undefined4 *)(puVar1 + 4) = in_EDX;
    *(undefined4 *)(puVar1 + 8) = in_ECX;
    *(undefined4 *)(puVar1 + 0xc) = in_R8D;
    *(int *)(puVar1 + 0x10) = in_R9D;
    puVar1[1] = 0xfd;
  }
  else {
    local_4 = addOp4IntSlow((Vdbe *)CONCAT44(in_ECX,in_R8D),in_R9D,local_4,-0x55555556,-0x55555556,
                            in_stack_ffffffffffffffcc);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOp4Int(
  Vdbe *p,            /* Add the opcode to this VM */
  int op,             /* The new opcode */
  int p1,             /* The P1 operand */
  int p2,             /* The P2 operand */
  int p3,             /* The P3 operand */
  int p4              /* The P4 operand as an integer */
){
  int i;
  VdbeOp *pOp;

  i = p->nOp;
  if( p->nOpAlloc<=i ){
    return addOp4IntSlow(p, op, p1, p2, p3, p4);
  }
  p->nOp++;
  pOp = &p->aOp[i];
  assert( pOp!=0 );
  pOp->opcode = (u8)op;
  pOp->p5 = 0;
  pOp->p1 = p1;
  pOp->p2 = p2;
  pOp->p3 = p3;
  pOp->p4.i = p4;
  pOp->p4type = P4_INT32;

  /* Replicate this logic in sqlite3VdbeAddOp3()
  ** vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv   */
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  pOp->zComment = 0;
#endif
#if defined(SQLITE_ENABLE_STMT_SCANSTATUS) || defined(VDBE_PROFILE)
  pOp->nExec = 0;
  pOp->nCycle = 0;
#endif
#ifdef SQLITE_DEBUG
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    sqlite3VdbePrintOp(0, i, &p->aOp[i]);
    test_addop_breakpoint(i, &p->aOp[i]);
  }
#endif
#ifdef SQLITE_VDBE_COVERAGE
  pOp->iSrcLine = 0;
#endif
  /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^
  ** Replicate in sqlite3VdbeAddOp3() */

  return i;
}